

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int pk_parse_key_pkcs1_der(mbedtls_rsa_context *rsa,uchar *key,size_t keylen)

{
  uchar *end_00;
  size_t sVar1;
  uchar *end;
  uchar *p;
  size_t len;
  size_t sStack_28;
  int ret;
  size_t keylen_local;
  uchar *key_local;
  mbedtls_rsa_context *rsa_local;
  
  end = key;
  sStack_28 = keylen;
  keylen_local = (size_t)key;
  key_local = (uchar *)rsa;
  len._4_4_ = mbedtls_asn1_get_tag(&end,key + keylen,(size_t *)&p,0x30);
  if (len._4_4_ == 0) {
    end_00 = end + (long)p;
    len._4_4_ = mbedtls_asn1_get_int(&end,end_00,(int *)key_local);
    if (len._4_4_ == 0) {
      if (*(int *)key_local == 0) {
        len._4_4_ = mbedtls_asn1_get_mpi(&end,end_00,(mbedtls_mpi *)(key_local + 0x10));
        if (((((len._4_4_ == 0) &&
              (len._4_4_ = mbedtls_asn1_get_mpi(&end,end_00,(mbedtls_mpi *)(key_local + 0x28)),
              len._4_4_ == 0)) &&
             (len._4_4_ = mbedtls_asn1_get_mpi(&end,end_00,(mbedtls_mpi *)(key_local + 0x40)),
             len._4_4_ == 0)) &&
            ((len._4_4_ = mbedtls_asn1_get_mpi(&end,end_00,(mbedtls_mpi *)(key_local + 0x58)),
             len._4_4_ == 0 &&
             (len._4_4_ = mbedtls_asn1_get_mpi(&end,end_00,(mbedtls_mpi *)(key_local + 0x70)),
             len._4_4_ == 0)))) &&
           ((len._4_4_ = mbedtls_asn1_get_mpi(&end,end_00,(mbedtls_mpi *)(key_local + 0x88)),
            len._4_4_ == 0 &&
            ((len._4_4_ = mbedtls_asn1_get_mpi(&end,end_00,(mbedtls_mpi *)(key_local + 0xa0)),
             len._4_4_ == 0 &&
             (len._4_4_ = mbedtls_asn1_get_mpi(&end,end_00,(mbedtls_mpi *)(key_local + 0xb8)),
             len._4_4_ == 0)))))) {
          sVar1 = mbedtls_mpi_size((mbedtls_mpi *)(key_local + 0x10));
          *(size_t *)(key_local + 8) = sVar1;
          if (end != end_00) {
            mbedtls_rsa_free((mbedtls_rsa_context *)key_local);
            return -0x3d66;
          }
          len._4_4_ = mbedtls_rsa_check_privkey((mbedtls_rsa_context *)key_local);
          if (len._4_4_ != 0) {
            mbedtls_rsa_free((mbedtls_rsa_context *)key_local);
            return len._4_4_;
          }
          return 0;
        }
        mbedtls_rsa_free((mbedtls_rsa_context *)key_local);
        rsa_local._4_4_ = len._4_4_ + -0x3d00;
      }
      else {
        rsa_local._4_4_ = -0x3d80;
      }
    }
    else {
      rsa_local._4_4_ = len._4_4_ + -0x3d00;
    }
  }
  else {
    rsa_local._4_4_ = len._4_4_ + -0x3d00;
  }
  return rsa_local._4_4_;
}

Assistant:

static int pk_parse_key_pkcs1_der( mbedtls_rsa_context *rsa,
                                   const unsigned char *key,
                                   size_t keylen )
{
    int ret;
    size_t len;
    unsigned char *p, *end;

    p = (unsigned char *) key;
    end = p + keylen;

    /*
     * This function parses the RSAPrivateKey (PKCS#1)
     *
     *  RSAPrivateKey ::= SEQUENCE {
     *      version           Version,
     *      modulus           INTEGER,  -- n
     *      publicExponent    INTEGER,  -- e
     *      privateExponent   INTEGER,  -- d
     *      prime1            INTEGER,  -- p
     *      prime2            INTEGER,  -- q
     *      exponent1         INTEGER,  -- d mod (p-1)
     *      exponent2         INTEGER,  -- d mod (q-1)
     *      coefficient       INTEGER,  -- (inverse of q) mod p
     *      otherPrimeInfos   OtherPrimeInfos OPTIONAL
     *  }
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    end = p + len;

    if( ( ret = mbedtls_asn1_get_int( &p, end, &rsa->ver ) ) != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    if( rsa->ver != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_VERSION );
    }

    if( ( ret = mbedtls_asn1_get_mpi( &p, end, &rsa->N  ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &rsa->E  ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &rsa->D  ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &rsa->P  ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &rsa->Q  ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &rsa->DP ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &rsa->DQ ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &rsa->QP ) ) != 0 )
    {
        mbedtls_rsa_free( rsa );
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    rsa->len = mbedtls_mpi_size( &rsa->N );

    if( p != end )
    {
        mbedtls_rsa_free( rsa );
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }

    if( ( ret = mbedtls_rsa_check_privkey( rsa ) ) != 0 )
    {
        mbedtls_rsa_free( rsa );
        return( ret );
    }

    return( 0 );
}